

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost2015_process_unprotected_attributes
              (stack_st_X509_ATTRIBUTE *attrs,int encryption,size_t mac_len,uchar *final_tag)

{
  ASN1_OBJECT *pAVar1;
  int *piVar2;
  stack_st_X509_ATTRIBUTE *psVar3;
  uchar *in_RCX;
  int in_EDX;
  int in_ESI;
  stack_st_X509_ATTRIBUTE *in_RDI;
  ASN1_OCTET_STRING *osExpectedMac;
  stack_st_X509_ATTRIBUTE *local_10;
  int local_4;
  
  if (in_ESI == 0) {
    pAVar1 = OBJ_txt2obj("1.2.643.7.1.0.6.1.1",1);
    piVar2 = (int *)X509at_get0_data_by_OBJ(in_RDI,pAVar1,-3,4);
    if ((piVar2 == (int *)0x0) || (*piVar2 != in_EDX)) {
      local_4 = -1;
    }
    else {
      memcpy(in_RCX,*(void **)(piVar2 + 2),(long)*piVar2);
      local_4 = 1;
    }
  }
  else if (in_RDI == (stack_st_X509_ATTRIBUTE *)0x0) {
    local_4 = -1;
  }
  else {
    pAVar1 = OBJ_txt2obj("1.2.643.7.1.0.6.1.1",1);
    psVar3 = X509at_add1_attr_by_OBJ(&local_10,pAVar1,4,in_RCX,in_EDX);
    local_4 = 1;
    if (psVar3 == (stack_st_X509_ATTRIBUTE *)0x0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int gost2015_process_unprotected_attributes(
    STACK_OF(X509_ATTRIBUTE) *attrs,
    int encryption, size_t mac_len, unsigned char *final_tag)
{
    if (encryption == 0) /*Decrypting*/ {
        ASN1_OCTET_STRING *osExpectedMac = X509at_get0_data_by_OBJ(attrs,
            OBJ_txt2obj(OID_GOST_CMS_MAC, 1), -3, V_ASN1_OCTET_STRING);

        if (!osExpectedMac || osExpectedMac->length != (int)mac_len)
            return -1;

        memcpy(final_tag, osExpectedMac->data, osExpectedMac->length);
    } else {
        if (attrs == NULL)
            return -1;
        return (X509at_add1_attr_by_OBJ(&attrs,
               OBJ_txt2obj(OID_GOST_CMS_MAC, 1),
               V_ASN1_OCTET_STRING, final_tag,
               mac_len) == NULL) ? -1 : 1;
    }
    return 1;
}